

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

value_type * __thiscall
wasm::Random::
pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
          (Random *this,
          vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
          *vec)

{
  pointer puVar1;
  pointer puVar2;
  uint32_t uVar3;
  
  puVar1 = (vec->
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (vec->
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)puVar2 - (long)puVar1) >> 3));
    return (vec->
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<std::unique_ptr<wasm::Tag>>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }